

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

field_type __thiscall
absl::container_internal::
btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
::max_count(btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
            *this)

{
  template_ElementType<2UL> *ptVar1;
  field_type max_count;
  field_type local_a;
  
  ptVar1 = btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>,compare_ptr,std::allocator<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>>,256,true>>
           ::GetField<2ul>(this);
  local_a = ptVar1[3];
  if (local_a == '\0') {
    local_a = '\x1e';
  }
  return local_a;
}

Assistant:

field_type max_count() const {
    // Internal nodes have max_count==kInternalNodeMaxCount.
    // Leaf nodes have max_count in [1, kNodeSlots].
    const field_type max_count = GetField<2>()[3];
    return max_count == field_type{kInternalNodeMaxCount}
               ? field_type{kNodeSlots}
               : max_count;
  }